

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void do_cmd_knowledge_features(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  int *obj_list;
  int local_88;
  wchar_t local_84;
  wchar_t i;
  wchar_t f_count;
  int *features;
  member_funcs feat_f;
  group_funcs fkind_f;
  wchar_t row_local;
  char *name_local;
  
  memcpy(&feat_f.is_visual,&PTR_fkind_name_003629c0,0x28);
  memcpy(&features,&PTR_display_feature_003629e8,0x38);
  local_84 = L'\0';
  obj_list = (int *)mem_zalloc(100);
  for (local_88 = 0; local_88 < 0x19; local_88 = local_88 + 1) {
    if ((f_info[local_88].name != (char *)0x0) && (f_info[local_88].mimic == (feature *)0x0)) {
      obj_list[local_84] = local_88;
      local_84 = local_84 + L'\x01';
    }
  }
  g_funcs.gcomp = (_func_wchar_t_void_ptr_void_ptr *)fkind_f.name;
  g_funcs.name = (_func_char_ptr_wchar_t *)feat_f._48_8_;
  g_funcs.group = (_func_wchar_t_wchar_t *)fkind_f.gcomp;
  g_funcs.summary = (_func_void_wchar_t_wchar_t_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)fkind_f.group;
  g_funcs._32_8_ = fkind_f.summary;
  o_funcs.lore = (_func_void_wchar_t *)feat_f.display_member;
  o_funcs.display_member = (_func_void_wchar_t_wchar_t__Bool_wchar_t *)features;
  o_funcs.xchar = (_func_wchar_t_ptr_wchar_t *)feat_f.lore;
  o_funcs.xattr = (_func_uint8_t_ptr_wchar_t *)feat_f.xchar;
  o_funcs.xtra_prompt = (_func_char_ptr_wchar_t *)feat_f.xattr;
  o_funcs.xtra_act = (_func_void_keypress_wchar_t *)feat_f.xtra_prompt;
  o_funcs._48_8_ = feat_f.xtra_act;
  display_knowledge("features",obj_list,local_84,g_funcs,o_funcs,"                    Sym");
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_features(const char *name, int row)
{
	group_funcs fkind_f = {fkind_name, f_cmp_fkind, feat_order, 0,
						   N_ELEMENTS(feature_group_text), false};

	member_funcs feat_f = {display_feature, feat_lore, f_xchar, f_xattr,
						   feat_prompt, f_xtra_act, 0};

	int *features;
	int f_count = 0;
	int i;

	features = mem_zalloc(FEAT_MAX * sizeof(int));

	for (i = 0; i < FEAT_MAX; i++) {
		/* Ignore non-features and mimics */
		if (f_info[i].name == 0 || f_info[i].mimic)
			continue;

		/* Currently no filter for features */
		features[f_count++] = i;
	}

	display_knowledge("features", features, f_count, fkind_f, feat_f,
					  "                    Sym");
	mem_free(features);
}